

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O1

void __thiscall
aeron::ClientConductor::ClientConductor
          (ClientConductor *this,epoch_clock_t *epochClock,DriverProxy *driverProxy,
          CopyBroadcastReceiver *broadcastReceiver,AtomicBuffer *counterMetadataBuffer,
          AtomicBuffer *counterValuesBuffer,on_new_publication_t *newPublicationHandler,
          on_new_publication_t *newExclusivePublicationHandler,
          on_new_subscription_t *newSubscriptionHandler,exception_handler_t *errorHandler,
          on_available_counter_t *availableCounterHandler,
          on_unavailable_counter_t *unavailableCounterHandler,long driverTimeoutMs,
          long resourceLingerTimeoutMs,longlong interServiceTimeoutNs)

{
  length_t lVar1;
  longlong lVar2;
  length_t lVar3;
  
  this->_vptr_ClientConductor = (_func_int **)&PTR__ClientConductor_00164730;
  *(undefined8 *)((long)&(this->m_adminLock).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_adminLock).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  memset(&this->m_publications,0,0x90);
  this->m_driverProxy = driverProxy;
  (this->m_driverListenerAdapter).m_broadcastReceiver = broadcastReceiver;
  (this->m_driverListenerAdapter).m_driverListener = this;
  (this->m_countersReader).m_metadataBuffer._vptr_AtomicBuffer =
       (_func_int **)&PTR__AtomicBuffer_001639b0;
  (this->m_countersReader).m_metadataBuffer.m_buffer = counterMetadataBuffer->m_buffer;
  (this->m_countersReader).m_metadataBuffer.m_length = counterMetadataBuffer->m_length;
  (this->m_countersReader).m_valuesBuffer._vptr_AtomicBuffer =
       (_func_int **)&PTR__AtomicBuffer_001639b0;
  (this->m_countersReader).m_valuesBuffer.m_buffer = counterValuesBuffer->m_buffer;
  (this->m_countersReader).m_valuesBuffer.m_length = counterValuesBuffer->m_length;
  lVar1 = counterValuesBuffer->m_length;
  lVar3 = lVar1 + 0x7f;
  if (-1 < (int)lVar1) {
    lVar3 = lVar1;
  }
  (this->m_countersReader).m_maxCounterId = (int)lVar3 >> 7;
  this->m_counterValuesBuffer = counterValuesBuffer;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  ::function(&this->m_onNewPublicationHandler,newPublicationHandler);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  ::function(&this->m_onNewExclusivePublicationHandler,newExclusivePublicationHandler);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
  ::function(&this->m_onNewSubscriptionHandler,newSubscriptionHandler);
  std::function<void_(const_std::exception_&)>::function(&this->m_errorHandler,errorHandler);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::function
            (&this->m_onAvailableCounterHandler,availableCounterHandler);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::function
            (&this->m_onUnavailableCounterHandler,unavailableCounterHandler);
  std::function<long_long_()>::function(&this->m_epochClock,epochClock);
  if ((epochClock->super__Function_base)._M_manager != (_Manager_type)0x0) {
    lVar2 = (*epochClock->_M_invoker)((_Any_data *)epochClock);
    this->m_timeOfLastKeepalive = lVar2;
    if ((epochClock->super__Function_base)._M_manager != (_Manager_type)0x0) {
      lVar2 = (*epochClock->_M_invoker)((_Any_data *)epochClock);
      this->m_timeOfLastCheckManagedResources = lVar2;
      if ((epochClock->super__Function_base)._M_manager != (_Manager_type)0x0) {
        lVar2 = (*epochClock->_M_invoker)((_Any_data *)epochClock);
        this->m_timeOfLastDoWork = lVar2;
        this->m_driverTimeoutMs = driverTimeoutMs;
        this->m_resourceLingerTimeoutMs = resourceLingerTimeoutMs;
        this->m_interServiceTimeoutMs = interServiceTimeoutNs / 1000000;
        this->m_driverActive = (__atomic_base<bool>)0x1;
        this->m_isClosed = (__atomic_base<bool>)0x0;
        return;
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

ClientConductor(
        epoch_clock_t epochClock,
        DriverProxy& driverProxy,
        CopyBroadcastReceiver& broadcastReceiver,
        AtomicBuffer& counterMetadataBuffer,
        AtomicBuffer& counterValuesBuffer,
        const on_new_publication_t& newPublicationHandler,
        const on_new_publication_t& newExclusivePublicationHandler,
        const on_new_subscription_t& newSubscriptionHandler,
        const exception_handler_t& errorHandler,
        const on_available_counter_t& availableCounterHandler,
        const on_unavailable_counter_t& unavailableCounterHandler,
        long driverTimeoutMs,
        long resourceLingerTimeoutMs,
        long long interServiceTimeoutNs) :
        m_driverProxy(driverProxy),
        m_driverListenerAdapter(broadcastReceiver, *this),
        m_countersReader(counterMetadataBuffer, counterValuesBuffer),
        m_counterValuesBuffer(counterValuesBuffer),
        m_onNewPublicationHandler(newPublicationHandler),
        m_onNewExclusivePublicationHandler(newExclusivePublicationHandler),
        m_onNewSubscriptionHandler(newSubscriptionHandler),
        m_errorHandler(errorHandler),
        m_onAvailableCounterHandler(availableCounterHandler),
        m_onUnavailableCounterHandler(unavailableCounterHandler),
        m_epochClock(epochClock),
        m_timeOfLastKeepalive(epochClock()),
        m_timeOfLastCheckManagedResources(epochClock()),
        m_timeOfLastDoWork(epochClock()),
        m_driverTimeoutMs(driverTimeoutMs),
        m_resourceLingerTimeoutMs(resourceLingerTimeoutMs),
        m_interServiceTimeoutMs(static_cast<long>(interServiceTimeoutNs / 1000000)),
        m_driverActive(true),
        m_isClosed(false)
    {
    }